

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_search.c
# Opt level: O0

ps_latnode_t *
new_node(ps_lattice_t *dag,fsg_model_t *fsg,int sf,int ef,int32 wid,int32 node_id,int32 ascr)

{
  ps_latnode_t *local_30;
  ps_latnode_t *node;
  int32 node_id_local;
  int32 wid_local;
  int ef_local;
  int sf_local;
  fsg_model_t *fsg_local;
  ps_lattice_t *dag_local;
  
  local_30 = find_node(dag,fsg,sf,wid,node_id);
  if (local_30 == (ps_latnode_t *)0x0) {
    local_30 = (ps_latnode_t *)
               __listelem_malloc__(dag->latnode_alloc,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                                   ,0x4d5);
    local_30->wid = wid;
    local_30->sf = sf;
    local_30->lef = ef;
    local_30->fef = ef;
    local_30->reachable = 0;
    local_30->entries = (latlink_list_t *)0x0;
    local_30->exits = (latlink_list_t *)0x0;
    (local_30->info).fanin = ascr;
    local_30->node_id = node_id;
    local_30->next = dag->nodes;
    dag->nodes = local_30;
    dag->n_nodes = dag->n_nodes + 1;
  }
  else {
    if ((local_30->lef == -1) || (local_30->lef < ef)) {
      local_30->lef = ef;
    }
    if ((local_30->fef == -1) || (ef < local_30->fef)) {
      local_30->fef = ef;
    }
    if ((local_30->info).fanin < ascr) {
      (local_30->info).fanin = ascr;
    }
  }
  return local_30;
}

Assistant:

static ps_latnode_t *
new_node(ps_lattice_t *dag, fsg_model_t *fsg, int sf, int ef, int32 wid, int32 node_id, int32 ascr)
{
    ps_latnode_t *node;

    node = find_node(dag, fsg, sf, wid, node_id);

    if (node) {
        /* Update end frames. */
        if (node->lef == -1 || node->lef < ef)
            node->lef = ef;
        if (node->fef == -1 || node->fef > ef)
            node->fef = ef;
        /* Update best link score. */
        if (ascr BETTER_THAN node->info.best_exit)
            node->info.best_exit = ascr;
    }
    else {
        /* New node; link to head of list */
        node = listelem_malloc(dag->latnode_alloc);
        node->wid = wid;
        node->sf = sf;
        node->fef = node->lef = ef;
        node->reachable = FALSE;
        node->entries = NULL;
        node->exits = NULL;
        node->info.best_exit = ascr;
        node->node_id = node_id;

        node->next = dag->nodes;
        dag->nodes = node;
        ++dag->n_nodes;
    }

    return node;
}